

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseTemplate
          (Parser *this,string *text,initializer_list<AssemblyTemplateArgument> variables)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  long in_R8;
  string fullText;
  string local_50;
  
  puVar3 = (undefined8 *)variables._M_len;
  pcVar2 = (variables._M_array)->variableName;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             ((variables._M_array)->value)._M_dataplus._M_p + (long)pcVar2);
  *(undefined1 *)&text[4]._M_string_length = 1;
  *(undefined8 *)((long)&text[4]._M_string_length + 4) = Global.FileInfo._0_8_;
  if (in_R8 != 0) {
    puVar1 = puVar3 + in_R8 * 5;
    do {
      replaceAll(&local_50,(char *)*puVar3,(string *)(puVar3 + 1));
      puVar3 = puVar3 + 5;
    } while (puVar3 != puVar1);
  }
  parseString(this,text);
  *(undefined1 *)&text[4]._M_string_length = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseTemplate(const std::string& text, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::string fullText = text;

	overrideFileInfo = true;
	overrideFileNum = Global.FileInfo.FileNum;
	overrideLineNum = Global.FileInfo.LineNumber;

	for (auto& arg: variables)
	{
		size_t count = replaceAll(fullText,arg.variableName,arg.value);
		(void)count;
#ifdef _DEBUG
		if (count != 0 && arg.value.empty())
			Logger::printError(Logger::Warning, "Empty replacement for %s",arg.variableName);
#endif
	}

	std::unique_ptr<CAssemblerCommand> result = parseString(fullText);
	overrideFileInfo = false;

	return result;
}